

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall
ON_SimpleArray<ON_PostEffect_*>::Insert
          (ON_SimpleArray<ON_PostEffect_*> *this,int i,ON_PostEffect **x)

{
  int iVar1;
  int newcapacity;
  void *temp;
  ON_PostEffect **p;
  ON_PostEffect **x_local;
  int i_local;
  ON_SimpleArray<ON_PostEffect_*> *this_local;
  
  if ((-1 < i) && (i <= this->m_count)) {
    temp = x;
    if (this->m_count == this->m_capacity) {
      if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
        temp = onmalloc(8);
        *(ON_PostEffect **)temp = *x;
      }
      iVar1 = NewCapacity(this);
      Reserve(this,(long)iVar1);
    }
    this->m_count = this->m_count + 1;
    Move(this,i + 1,i,(this->m_count + -1) - i);
    this->m_a[i] = *temp;
    if ((ON_PostEffect **)temp != x) {
      onfree(temp);
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}